

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTimeCoordinator.cpp
# Opt level: O1

MessageProcessingResult __thiscall
helics::GlobalTimeCoordinator::checkExecEntry(GlobalTimeCoordinator *this,GlobalFederateId param_1)

{
  pointer pDVar1;
  pointer pDVar2;
  bool bVar3;
  bool bVar4;
  pointer pDVar5;
  MessageProcessingResult MVar6;
  string_view str;
  ActionMessage execgrant;
  ActionMessage local_d0;
  
  if ((this->super_BaseTimeCoordinator).checkingExec == false) {
    MVar6 = CONTINUE_PROCESSING;
    if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager !=
        (_Manager_type)0x0) {
      ActionMessage::ActionMessage(&local_d0,cmd_log);
      local_d0.messageID = 3;
      local_d0.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
      str._M_str = "calling checkExecEntry without first calling enterExec this is probably a bug";
      str._M_len = 0x4d;
      local_d0.dest_id.gid = local_d0.source_id.gid;
      ActionMessage::setString(&local_d0,0,str);
      if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager ==
          (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->super_BaseTimeCoordinator).sendMessageFunction._M_invoker)
                ((_Any_data *)&(this->super_BaseTimeCoordinator).sendMessageFunction,&local_d0);
      ActionMessage::~ActionMessage(&local_d0);
    }
  }
  else {
    bVar4 = TimeDependencies::checkIfReadyForExecEntry
                      (&(this->super_BaseTimeCoordinator).dependencies,false,false);
    if (!bVar4) {
      if (this->currentTimeState != exec_requested_iterative) {
        return CONTINUE_PROCESSING;
      }
      pDVar1 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pDVar2 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pDVar1 != pDVar2) {
        bVar4 = true;
        do {
          pDVar5 = pDVar1 + 1;
          if ((pDVar1->dependency == true) &&
             ((bVar3 = true,
              (pDVar1->super_TimeData).minFed.gid != (this->super_BaseTimeCoordinator).mSourceId.gid
              || ((pDVar1->super_TimeData).responseSequenceCounter !=
                  (this->super_BaseTimeCoordinator).sequenceCounter)))) {
            bVar4 = false;
          }
          else {
            bVar3 = false;
          }
        } while ((!bVar3) && (pDVar1 = pDVar5, pDVar5 != pDVar2));
        if (!bVar4) {
          return CONTINUE_PROCESSING;
        }
      }
    }
    (this->super_BaseTimeCoordinator).executionMode = true;
    (this->currentMinTime).internalTimeCode = 0;
    this->currentTimeState = time_granted;
    (this->nextEvent).internalTimeCode = 0;
    ActionMessage::ActionMessage(&local_d0,cmd_exec_grant);
    local_d0.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
    transmitTimingMessagesDownstream(this,&local_d0,(GlobalFederateId)0x8831d580);
    transmitTimingMessagesUpstream(this,&local_d0);
    ActionMessage::~ActionMessage(&local_d0);
    MVar6 = NEXT_STEP;
  }
  return MVar6;
}

Assistant:

MessageProcessingResult GlobalTimeCoordinator::checkExecEntry(GlobalFederateId /*triggerFed*/)
{
    if (!checkingExec) {
        if (sendMessageFunction) {
            ActionMessage logcmd(CMD_LOG);
            logcmd.messageID = HELICS_LOG_LEVEL_WARNING;
            logcmd.dest_id = mSourceId;
            logcmd.source_id = mSourceId;
            logcmd.setString(
                0, "calling checkExecEntry without first calling enterExec this is probably a bug");
            sendMessageFunction(logcmd);
        }
        return MessageProcessingResult::CONTINUE_PROCESSING;
    }
    auto ret = MessageProcessingResult::CONTINUE_PROCESSING;
    if (!dependencies.checkIfReadyForExecEntry(false, false)) {
        bool allowed{false};
        if (currentTimeState == TimeState::exec_requested_iterative) {
            allowed = true;
            for (const auto& dep : dependencies) {
                if (dep.dependency) {
                    if (dep.minFed != mSourceId) {
                        allowed = false;
                        break;
                    }
                    if (dep.responseSequenceCounter != sequenceCounter) {
                        allowed = false;
                        break;
                    }
                }
            }
        }
        if (!allowed) {
            return ret;
        }
    }
    executionMode = true;
    ret = MessageProcessingResult::NEXT_STEP;

    currentMinTime = timeZero;
    currentTimeState = TimeState::time_granted;
    nextEvent = timeZero;

    ActionMessage execgrant(CMD_EXEC_GRANT);
    execgrant.source_id = mSourceId;
    transmitTimingMessagesDownstream(execgrant);
    transmitTimingMessagesUpstream(execgrant);
    return ret;
}